

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O2

void enterinc(global_State *g)

{
  whitelist(g,g->allgc);
  g->reallyold = (GCObject *)0x0;
  g->survival = (GCObject *)0x0;
  g->old1 = (GCObject *)0x0;
  whitelist(g,g->finobj);
  whitelist(g,g->tobefnz);
  g->finobjrold = (GCObject *)0x0;
  g->finobjsur = (GCObject *)0x0;
  g->finobjold1 = (GCObject *)0x0;
  g->gcstate = '\b';
  g->gckind = '\0';
  g->lastatomic = 0;
  return;
}

Assistant:

static void enterinc (global_State *g) {
  whitelist(g, g->allgc);
  g->reallyold = g->old1 = g->survival = NULL;
  whitelist(g, g->finobj);
  whitelist(g, g->tobefnz);
  g->finobjrold = g->finobjold1 = g->finobjsur = NULL;
  g->gcstate = GCSpause;
  g->gckind = KGC_INC;
  g->lastatomic = 0;
}